

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log.c
# Opt level: O0

void ecs_log_print(int level,char *file,int32_t line,char *fmt,__va_list_tag *valist)

{
  char *pcVar1;
  char *pcVar2;
  char *color_msg;
  char *msg;
  undefined1 local_168 [4];
  int i;
  char indent [32];
  char *file_ptr;
  char filebuff [256];
  __va_list_tag *valist_local;
  char *fmt_local;
  char **ppcStack_18;
  int32_t line_local;
  char *file_local;
  int level_local;
  
  if (level <= trace_level) {
    strcpy((char *)&file_ptr,file);
    ppcStack_18 = &file_ptr;
    pcVar1 = strrchr((char *)ppcStack_18,0x2f);
    if (pcVar1 != (char *)0x0) {
      ppcStack_18 = (char **)(pcVar1 + 1);
    }
    pcVar1 = strrchr((char *)ppcStack_18,0x2e);
    if (pcVar1 != (char *)0x0) {
      *pcVar1 = '\0';
    }
    for (msg._4_4_ = 0; msg._4_4_ < trace_indent; msg._4_4_ = msg._4_4_ + 1) {
      local_168[msg._4_4_ << 1] = 0x7c;
      local_168[msg._4_4_ * 2 + 1] = 0x20;
    }
    local_168[msg._4_4_ << 1] = 0;
    pcVar1 = ecs_vasprintf(fmt,valist);
    pcVar2 = ecs_colorize(pcVar1);
    if (level < 0) {
      if (level == -2) {
        ecs_os_warn("%swarn%s: %s%s%s%s","\x1b[0;33m","\x1b[0;49m","\x1b[0;37m",local_168,
                    "\x1b[0;49m",pcVar2);
      }
      else if (level < -1) {
        ecs_os_err("%serr %s: %s%s%s%s","\x1b[0;31m","\x1b[0;49m","\x1b[0;37m",local_168,
                   "\x1b[0;49m",pcVar2);
      }
    }
    else {
      ecs_os_log("%sinfo%s: %s%s%s%s","\x1b[0;35m","\x1b[0;49m","\x1b[0;37m",local_168,"\x1b[0;49m",
                 pcVar2);
    }
    (*ecs_os_api.free_)(pcVar2);
    (*ecs_os_api.free_)(pcVar1);
  }
  return;
}

Assistant:

static
void ecs_log_print(
    int level,
    const char *file,
    int32_t line,
    const char *fmt,
    va_list valist)
{
    (void)level;
    (void)line;

    if (level > trace_level) {
        return;
    }

    /* Massage filename so it doesn't take up too much space */
    char filebuff[256];
    ecs_os_strcpy(filebuff, file);
    file = filebuff;
    char *file_ptr = strrchr(file, '/');
    if (file_ptr) {
        file = file_ptr + 1;
    }

    /* Extension is likely the same for all files */
    file_ptr = strrchr(file, '.');
    if (file_ptr) {
        *file_ptr = '\0';
    }

    char indent[32];
    int i;
    for (i = 0; i < trace_indent; i ++) {
        indent[i * 2] = '|';
        indent[i * 2 + 1] = ' ';
    }
    indent[i * 2] = '\0';

    char *msg = ecs_vasprintf(fmt, valist);
    char *color_msg = ecs_colorize(msg);

    if (level >= 0) {
        ecs_os_log("%sinfo%s: %s%s%s%s",
            ECS_MAGENTA, ECS_NORMAL, ECS_GREY, indent, ECS_NORMAL, color_msg);
    } else if (level == -2) {
        ecs_os_warn("%swarn%s: %s%s%s%s",
            ECS_YELLOW, ECS_NORMAL, ECS_GREY, indent, ECS_NORMAL, color_msg);
    } else if (level <= -2) {
        ecs_os_err("%serr %s: %s%s%s%s",
            ECS_RED, ECS_NORMAL, ECS_GREY, indent, ECS_NORMAL, color_msg);
    }

    ecs_os_free(color_msg);
    ecs_os_free(msg);
}